

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

int __thiscall mpt::client::dispatch(client *this,event *ev)

{
  message *pmVar1;
  reply_context *prVar2;
  int iVar3;
  ssize_t sVar4;
  size_t in_RCX;
  msgtype mt;
  message msg;
  undefined2 local_3a;
  message local_38;
  
  if (ev == (event *)0x0) {
LAB_00129858:
    iVar3 = 0;
  }
  else {
    pmVar1 = ev->msg;
    if (pmVar1 == (message *)0x0) {
      iVar3 = (*(this->super_metatype).super_convertable._vptr_convertable[5])(this,0,0);
      return iVar3;
    }
    local_38.used = pmVar1->used;
    local_38.base = pmVar1->base;
    local_38.cont = pmVar1->cont;
    local_38.clen = pmVar1->clen;
    local_3a = 0;
    sVar4 = message::read(&local_38,2,&local_3a,in_RCX);
    if ((char)local_3a == '\x04' || sVar4 == 0) {
      iVar3 = mpt_client_command(this,&local_38,(int)local_3a._1_1_);
      prVar2 = ev->reply;
      if (-1 < iVar3) {
        if (prVar2 != (reply_context *)0x0) {
          mpt_context_reply(prVar2,0,"%s","command message dispatched");
          return 0;
        }
        goto LAB_00129858;
      }
      mpt_context_reply(prVar2,iVar3,"%s","command message dispatch failed");
    }
    else {
      mpt_context_reply(ev->reply,0xfffffffd,"%s (%02x)","bad message type",(char)local_3a);
    }
    ev->id = 0;
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

int client::dispatch(event *ev)
{
	if (!ev) {
		return 0;
	}
	if (!ev->msg) {
		return process(0);
	}
	message msg = *ev->msg;
	
	msgtype mt;
	if (msg.read(sizeof(mt), &mt) > 0
	 && mt.cmd != msgtype::Command) {
		mpt_context_reply(ev->reply, MPT_ERROR(BadType), "%s (%02x)", MPT_tr("bad message type"), mt.cmd);
		ev->id = 0;
		return ev->Fail | ev->Default;
	}
	int ret = mpt_client_command(this, &msg, mt.arg);
	if (ret < 0) {
		mpt_context_reply(ev->reply, ret, "%s", MPT_tr("command message dispatch failed"));
		ev->id = 0;
		return ev->Fail | ev->Default;
	}
	if (ev->reply) {
		mpt_context_reply(ev->reply, 0, "%s", MPT_tr("command message dispatched"));
	}
	return ev->None;
}